

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::format_currency<false>
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          longdouble val)

{
  ios_base *this_00;
  fmtflags __a;
  _Ios_Fmtflags __fmtfl;
  money_put *pmVar1;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  undefined4 in_R8D;
  iter_type iVar2;
  longdouble in_stack_00000008;
  fmtflags f;
  int digits;
  locale loc;
  ios_base *in_stack_ffffffffffffff08;
  int local_64;
  locale local_60;
  longdouble local_58;
  undefined4 local_3c;
  ios_base *local_38;
  streambuf_type *local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  streambuf_type *local_18;
  undefined8 uStack_10;
  
  uStack_20 = CONCAT31(uStack_20._1_3_,in_DL);
  local_58 = in_stack_00000008;
  local_3c = in_R8D;
  local_38 = in_RCX;
  local_28 = (streambuf_type *)in_RSI;
  std::ios_base::getloc(in_stack_ffffffffffffff08);
  std::use_facet<std::__cxx11::moneypunct<wchar_t,false>>(&local_60);
  for (local_64 = std::__cxx11::moneypunct<wchar_t,false>::frac_digits(); 0 < local_64;
      local_64 = local_64 + -1) {
    local_58 = (longdouble)10.0 * local_58;
  }
  __a = std::ios_base::flags(local_38);
  this_00 = local_38;
  __fmtfl = std::operator|(__a,_S_showbase);
  std::ios_base::flags(this_00,__fmtfl);
  pmVar1 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&local_60);
  local_28 = (streambuf_type *)
             std::__cxx11::
             money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::put
                       (pmVar1,local_28,uStack_20,0,local_38,local_3c,local_58);
  uStack_20 = CONCAT31(uStack_20._1_3_,extraout_DL);
  std::ios_base::flags(local_38,__a);
  uStack_10 = CONCAT44(uStack_1c,uStack_20);
  local_18 = local_28;
  std::locale::~locale(&local_60);
  iVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  iVar2._M_failed = (bool)(undefined1)uStack_10;
  iVar2._M_sbuf = local_18;
  return iVar2;
}

Assistant:

iter_type format_currency(iter_type out,std::ios_base &ios,char_type fill,long double val) const
    {
        std::locale loc = ios.getloc();
        int digits = std::use_facet<std::moneypunct<char_type,intl> >(loc).frac_digits();
        while(digits > 0) {
            val*=10;
            digits --;
        }
        std::ios_base::fmtflags f=ios.flags();
        ios.flags(f | std::ios_base::showbase);
        out = std::use_facet<std::money_put<char_type> >(loc).put(out,intl,ios,fill,val);
        ios.flags(f);
        return out;
    }